

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall cs222::Parser::Parser(Parser *this,istream *inputStream)

{
  byte bVar1;
  runtime_error *this_00;
  istream *inputStream_local;
  Parser *this_local;
  
  this->_vptr_Parser = (_func_int **)&PTR_next_0016a840;
  this->inputStream = inputStream;
  this->lineNumber = 0;
  std::__cxx11::string::string((string *)&this->line);
  std::bitset<6UL>::bitset(&this->flags);
  std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
  unique_ptr<std::default_delete<cs222::Instruction>,void>
            ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)
             &this->nextInstruction);
  bVar1 = std::ios::operator!((ios *)(inputStream + *(long *)(*(long *)inputStream + -0x18)));
  if ((bVar1 & 1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Parser: malformed input stream");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parser::Parser(std::istream& inputStream) :
        inputStream(inputStream), lineNumber(0)
    {
        if (!inputStream)
        {
            throw std::runtime_error("Parser: malformed input stream");
        }
    }